

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int begin_set_next_outgoing_id(BEGIN_HANDLE begin,transfer_number next_outgoing_id_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  AMQP_VALUE next_outgoing_id_amqp_value;
  BEGIN_INSTANCE *begin_instance;
  int result;
  transfer_number next_outgoing_id_value_local;
  BEGIN_HANDLE begin_local;
  
  if (begin == (BEGIN_HANDLE)0x0) {
    begin_instance._0_4_ = 0xad7;
  }
  else {
    item_value = amqpvalue_create_transfer_number(next_outgoing_id_value);
    if (item_value == (AMQP_VALUE)0x0) {
      begin_instance._0_4_ = 0xadf;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(begin->composite_value,1,item_value);
      if (iVar1 == 0) {
        begin_instance._0_4_ = 0;
      }
      else {
        begin_instance._0_4_ = 0xae5;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return (int)begin_instance;
}

Assistant:

int begin_set_next_outgoing_id(BEGIN_HANDLE begin, transfer_number next_outgoing_id_value)
{
    int result;

    if (begin == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        BEGIN_INSTANCE* begin_instance = (BEGIN_INSTANCE*)begin;
        AMQP_VALUE next_outgoing_id_amqp_value = amqpvalue_create_transfer_number(next_outgoing_id_value);
        if (next_outgoing_id_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(begin_instance->composite_value, 1, next_outgoing_id_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(next_outgoing_id_amqp_value);
        }
    }

    return result;
}